

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

ImageFeatureType * __thiscall
CoreML::Specification::ImageFeatureType::New(ImageFeatureType *this,Arena *arena)

{
  ImageFeatureType *this_00;
  
  this_00 = (ImageFeatureType *)operator_new(0x38);
  ImageFeatureType(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ImageFeatureType>(arena,this_00);
  }
  return this_00;
}

Assistant:

ImageFeatureType* ImageFeatureType::New(::google::protobuf::Arena* arena) const {
  ImageFeatureType* n = new ImageFeatureType;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}